

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)

{
  uchar uVar1;
  uint8_t uVar2;
  bool bVar3;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  uVar2 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,uVar2,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::intensityArray(&intensity,3);
  Unit_Test::fillImage(&input,0,0,input._width,input._height,&intensity);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (&output,&input,input._width,input._height,input._colorCount,input._alignment);
  uVar2 = Unit_Test::intensityValue();
  Unit_Test::fillImage(&output,0,0,output._width,output._height,uVar2);
  (*RgbToBgr)(&input,&output);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar1;
  bVar3 = Unit_Test::verifyImage(&output,&intensity,false);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar3;
}

Assistant:

bool form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        PenguinV_Image::Image output = input.generate( input.width(), input.height(), input.colorCount(), input.alignment() );
        fillImage( output, 0, 0, output.width(), output.height(), intensityValue() );

        RgbToBgr( input, output );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( output, intensity, false );
    }